

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

char * StringToUnicode(char *cc,int size)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  char *pcVar4;
  uint amount;
  uint uVar5;
  int iVar6;
  int local_24;
  
  if (out.Count != 0) {
    out.Count = 0;
  }
  lVar2 = 0;
  uVar5 = 0;
  do {
    if (cc[lVar2] == 0) {
      size = (int)lVar2;
      break;
    }
    uVar5 = uVar5 + ((byte)cc[lVar2] >> 7) + 1;
    lVar2 = lVar2 + 1;
  } while (size != (int)lVar2);
  pcVar4 = cc;
  if (uVar5 != size) {
    amount = uVar5 + 1;
    if (amount != 0) {
      TArray<char,_char>::Grow(&out,amount);
    }
    out.Count = amount;
    out.Array[uVar5] = '\0';
    bVar1 = *cc;
    pcVar4 = out.Array;
    if (bVar1 != 0) {
      pbVar3 = (byte *)(cc + 1);
      iVar6 = 0;
      do {
        utf8_encode((uint)bVar1,out.Array + iVar6,&local_24);
        iVar6 = iVar6 + size;
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
        pcVar4 = out.Array;
      } while (bVar1 != 0);
    }
  }
  return pcVar4;
}

Assistant:

static const char *StringToUnicode(const char *cc, int size = -1)
{
	int ch;
	const char *c = cc;
	int count = 0;
	int count1 = 0;
	out.Clear();
	while ((ch = (*c++) & 255))
	{
		count1++;
		if (ch >= 128)
		{
			if (ch < 0x800) count += 2;
			else count += 3;
			// The source cannot contain 4-byte chars.
		}
		else count++;
		if (count1 == size && size > 0) break;
	}
	if (count == count1) return cc;	// string is pure ASCII.
	// we need to convert
	out.Resize(count + 1);
	out.Last() = 0;
	c = cc;
	int i = 0;
	while ((ch = (*c++) & 255))
	{
		utf8_encode(ch, &out[i], &count1);
		i += count1;
	}
	return &out[0];
}